

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O0

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removedCol(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,int i)

{
  bool bVar1;
  Representation RVar2;
  SPxStatus SVar3;
  int iVar4;
  DataKey *pDVar5;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **ppSVar7;
  Status *pSVar8;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  SPxId id;
  int j;
  SPxColId *in_stack_ffffffffffffff88;
  int iVar9;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Status SVar10;
  undefined8 in_stack_ffffffffffffff98;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar11;
  undefined7 in_stack_ffffffffffffffc0;
  byte in_stack_ffffffffffffffc7;
  SPxColId local_20;
  DataKey local_18;
  int local_10;
  
  SVar3 = (SPxStatus)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  RVar2 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::rep(in_RDI->theLP);
  iVar9 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (RVar2 == COLUMN) {
    Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),iVar9);
    bVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      (Status)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    if (bVar1) {
      setStatus(in_stack_ffffffffffffffa0,SVar3);
    }
  }
  else {
    in_RDI->factorized = false;
    Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),iVar9);
    bVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      (Status)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    if (bVar1) {
      SVar3 = status(in_RDI);
      if (NO_PROBLEM < SVar3) {
        for (local_10 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x6a6400); -1 < local_10; local_10 = local_10 + -1) {
          pDVar5 = &baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           (int)((ulong)in_stack_ffffffffffffff88 >> 0x20))->super_DataKey;
          local_18 = *pDVar5;
          bVar1 = SPxId::isSPxColId((SPxId *)&local_18);
          in_stack_ffffffffffffffc7 = 0;
          if (bVar1) {
            SPxColId::SPxColId(&local_20,(SPxId *)&local_18);
            bVar1 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::has((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff88);
            in_stack_ffffffffffffffc7 = bVar1 ^ 0xff;
          }
          if ((in_stack_ffffffffffffffc7 & 1) != 0) {
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x6a648b);
            iVar9 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
            this_00 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                iVar9);
            pDVar5 = &baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),iVar9)
                      ->super_DataKey;
            *pDVar5 = (DataKey)(this_00->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._vptr_ClassArray;
            if (((in_RDI->matrixIsSetup & 1U) != 0) &&
               (iVar11 = local_10,
               iVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)0x6a64d9), iVar11 < iVar4)) {
              baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),iVar9);
              pSVar6 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::vector(this_00,(SPxId *)CONCAT44(iVar11,in_stack_ffffffffffffffa8));
              ppSVar7 = DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
                        ::operator[](&in_RDI->matrix,local_10);
              *ppSVar7 = pSVar6;
            }
            break;
          }
        }
      }
    }
    else {
      setStatus(in_stack_ffffffffffffffa0,SVar3);
    }
  }
  iVar9 = (int)((ulong)&in_RDI->thedesc >> 0x20);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x6a655c);
  pSVar8 = Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           iVar9);
  SVar10 = *pSVar8;
  pSVar8 = Desc::colStatus((Desc *)CONCAT44(SVar10,in_stack_ffffffffffffff90),iVar9);
  *pSVar8 = SVar10;
  reDim((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  return;
}

Assistant:

void SPxBasisBase<R>::removedCol(int i)
{
   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);

   if(theLP->rep() == SPxSolverBase<R>::COLUMN)
   {
      if(theLP->isBasic(thedesc.colStatus(i)))
         setStatus(NO_PROBLEM);
   }
   else
   {
      assert(theLP->rep() == SPxSolverBase<R>::ROW);
      factorized = false;

      if(!theLP->isBasic(thedesc.colStatus(i)))
         setStatus(NO_PROBLEM);
      else if(status() > NO_PROBLEM)
      {
         for(int j = theLP->dim(); j >= 0; --j)
         {
            SPxId id = baseId(j);

            if(id.isSPxColId() && !theLP->has(SPxColId(id)))
            {
               baseId(j) = baseId(theLP->dim());

               if(matrixIsSetup &&
                     j < theLP->dim())
                  matrix[j] = &theLP->vector(baseId(j));

               break;
            }
         }
      }
   }

   thedesc.colStatus(i) = thedesc.colStatus(theLP->nCols());
   reDim();
}